

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O2

void __thiscall NaDynAr<NaVector>::clean(NaDynAr<NaVector> *this)

{
  item *piVar1;
  int iVar2;
  item *this_00;
  item *c;
  
  if (this->pHead != (item *)0x0) {
    iVar2 = 0;
    this_00 = this->pHead;
    do {
      piVar1 = this_00->pNext;
      item::~item(this_00);
      operator_delete(this_00,0x10);
      if (piVar1 == (item *)0x0) break;
      iVar2 = iVar2 + 1;
      this_00 = piVar1;
    } while (iVar2 < this->nItems);
  }
  this->nItems = 0;
  this->pHead = (item *)0x0;
  this->pTail = (item *)0x0;
  return;
}

Assistant:

virtual void	clean () {
#ifdef DynAr_DEBUG
    NaPrintLog("DynAr::clean(this=0x%08p), %d items, contents:\n",
	       this, nItems);
#endif /* DynAr_DEBUG */

    int   i = 0;
    if(NULL != pHead){
      item	*p = pHead;

      do{
        item	*c = p;
#ifdef DynAr_DEBUG
        NaPrintLog("  [%d]\tcur=0x%08p\t", i);
        c->print_self();
#endif /* DynAr_DEBUG */
	p = p->pNext;
	delete c;
        ++i;
      }while(NULL != p && i < nItems);
    }
    pTail = pHead = NULL;
    nItems = 0;
  }